

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.hpp
# Opt level: O2

void __thiscall Lib::Deque<Kernel::Clause_*>::~Deque(Deque<Kernel::Clause_*> *this)

{
  Lib::free(this->_data);
  return;
}

Assistant:

inline ~Deque()
  {
    C* p=_back;
    while(p!=_front) {
      if(p==_data) {
	p=_end;
      }
      (--p)->~C();
    }
    DEALLOC_KNOWN(_data,_capacity*sizeof(C),"Deque<>");
  }